

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

ValueInfo * __thiscall
GlobOpt::NewIntRangeValueInfo(GlobOpt *this,ValueInfo *originalValueInfo,int32 min,int32 max)

{
  JitArenaAllocator *allocator;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntRangeValueInfo *this_00;
  
  if (originalValueInfo == (ValueInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x110a,"(originalValueInfo)","originalValueInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  allocator = this->alloc;
  if (min == max) {
    this_00 = (IntRangeValueInfo *)
              _IntConstantValueInfo<int,_IntConstantValueInfo,_(ValueStructureKind)1>::New
                        (allocator,min);
  }
  else {
    if (max < 0 || 0 < min) {
      bVar2 = false;
    }
    else {
      bVar2 = ValueInfo::WasNegativeZeroPreventedByBailout(originalValueInfo);
    }
    this_00 = IntRangeValueInfo::New(allocator,min,max,bVar2);
  }
  ValueInfo::SetSymStore(&this_00->super_ValueInfo,originalValueInfo->symStore);
  return &this_00->super_ValueInfo;
}

Assistant:

ValueInfo *GlobOpt::NewIntRangeValueInfo(
    const ValueInfo *const originalValueInfo,
    const int32 min,
    const int32 max) const
{
    Assert(originalValueInfo);

    ValueInfo *valueInfo;
    if(min == max)
    {
        // Since int constant values are const-propped, negative zero tracking does not track them, and so it's okay to ignore
        // 'wasNegativeZeroPreventedByBailout'
        valueInfo = IntConstantValueInfo::New(alloc, min);
    }
    else
    {
        valueInfo =
            IntRangeValueInfo::New(
                alloc,
                min,
                max,
                min <= 0 && max >= 0 && originalValueInfo->WasNegativeZeroPreventedByBailout());
    }
    valueInfo->SetSymStore(originalValueInfo->GetSymStore());
    return valueInfo;
}